

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_long,char_const(&)[14],char_const(&)[7]>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          char (*args_2) [14],char (*args_3) [7])

{
  format_args args_00;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  uint *in_RCX;
  v10 *in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  unsigned_long *in_R8;
  char (*in_R9) [14];
  unsigned_long_long in_stack_00000098;
  ValidationReport *__args;
  string *psVar2;
  char *pcVar3;
  undefined8 local_1a8;
  allocator<char> *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_181;
  undefined1 local_180;
  undefined2 local_17e;
  char local_178 [32];
  undefined1 auStack_158 [48];
  uint *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[14],_char[7]>
  local_108;
  undefined8 local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[14],_char[7]>
  *local_c0;
  char (*local_a8) [14];
  unsigned_long *local_a0;
  uint *local_98;
  v10 *local_90;
  undefined8 local_88 [2];
  ValidationReport *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[14],_char[7]>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[14],_char[7]>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[14],_char[7]>
  *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  auStack_158._32_8_ = in_R9;
  auStack_158._40_8_ = in_R8;
  local_128 = in_RCX;
  local_120._M_allocated_capacity = (size_type)in_RDX;
  local_120._8_8_ = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_180 = *(undefined1 *)local_120._8_8_;
  local_17e = *(undefined2 *)(local_120._8_8_ + 2);
  pcVar3 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  __args = (ValidationReport *)auStack_158;
  local_60 = (undefined8 *)(local_120._8_8_ + 0x18);
  local_58 = &local_1a8;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_120._8_8_ + 0x20);
  s._M_str = pcVar3;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_60;
  local_88[0] = local_1a8;
  local_90 = (v10 *)local_120._M_allocated_capacity;
  local_98 = local_128;
  local_a0 = (unsigned_long *)auStack_158._40_8_;
  local_a8 = (char (*) [14])auStack_158._32_8_;
  local_50 = local_88;
  local_78 = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long,char_const[14],char_const[7]>
            (&local_108,(v10 *)local_120._M_allocated_capacity,local_128,
             (unsigned_long *)auStack_158._40_8_,(char (*) [14])auStack_158._32_8_,
             (char (*) [7])__args);
  local_30 = &local_c8;
  local_38 = &local_108;
  local_20 = 0xcc42;
  local_c8 = 0xcc42;
  fmt.size_ = (size_t)args_1;
  fmt.data_ = *args_2;
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
  args_00.desc_ = in_stack_00000098;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_c0 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator(&local_181);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }